

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O0

string * FormatException_abi_cxx11_(exception *pex,string_view thread_name)

{
  basic_string_view<char,_std::char_traits<char>_> *args_3;
  char **in_RCX;
  char **in_RDX;
  long *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  char *pszModule;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd8;
  char **args_2;
  char *fmt;
  
  fmt = *(char **)(in_FS_OFFSET + 0x28);
  args_2 = (char **)0x289a17;
  if (in_RSI == (long *)0x0) {
    tinyformat::format<char_const*,std::basic_string_view<char,std::char_traits<char>>>
              ((char *)in_RDX,(char **)0x289a17,in_stack_ffffffffffffffd8);
  }
  else {
    if (in_RSI == (long *)0x0) {
      if (*(char **)(in_FS_OFFSET + 0x28) != fmt) goto LAB_001a52a6;
      __cxa_bad_typeid();
    }
    args_3 = (basic_string_view<char,_std::char_traits<char>_> *)
             std::type_info::name((type_info *)in_RDI);
    (**(code **)(*in_RSI + 0x10))();
    tinyformat::
    format<char_const*,char_const*,char_const*,std::basic_string_view<char,std::char_traits<char>>>
              (fmt,in_RCX,in_RDX,args_2,args_3);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == fmt) {
    return in_RDI;
  }
LAB_001a52a6:
  __stack_chk_fail();
}

Assistant:

static std::string FormatException(const std::exception* pex, std::string_view thread_name)
{
#ifdef WIN32
    char pszModule[MAX_PATH] = "";
    GetModuleFileNameA(nullptr, pszModule, sizeof(pszModule));
#else
    const char* pszModule = "bitcoin";
#endif
    if (pex)
        return strprintf(
            "EXCEPTION: %s       \n%s       \n%s in %s       \n", typeid(*pex).name(), pex->what(), pszModule, thread_name);
    else
        return strprintf(
            "UNKNOWN EXCEPTION       \n%s in %s       \n", pszModule, thread_name);
}